

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::BlendingCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "uniform mediump vec4 u_special;\nvoid main ()\n{\n\tgl_FragColor = u_special;\n}\n",""
            );
  return __return_storage_ptr__;
}

Assistant:

std::string BlendingCase::genFragmentSource (void) const
{
	return
		"uniform mediump vec4 u_special;\n"
		"void main ()\n"
		"{\n"
		"	gl_FragColor = u_special;\n"
		"}\n";
}